

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

ostream * despot::operator<<(ostream *os,
                            vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                            *vec)

{
  ostream *poVar1;
  char *pcVar2;
  int i;
  ulong uVar3;
  
  std::operator<<(os,"[");
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(vec->
                            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->
                            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    pcVar2 = ", ";
    if (uVar3 == 0) {
      pcVar2 = "";
    }
    poVar1 = std::operator<<(os,pcVar2);
    std::ostream::_M_insert<void_const*>(poVar1);
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}